

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_NoParent_Test::TestBody
          (DiskSourceTreeTest_NoParent_Test *this)

{
  pointer pbVar1;
  Nonnull<const_char_*> failure_msg;
  char *contents;
  char *contents_00;
  string_view disk_path;
  LogMessageFatal local_b0;
  undefined1 local_a0 [32];
  string local_80;
  AlphaNum local_50;
  
  pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
  local_50.piece_ = absl::lts_20250127::NullSafeStringView("/foo");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_a0,(lts_20250127 *)(local_a0 + 0x20),&local_50,&local_50);
  DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_a0,(string *)"Hello World!",contents);
  std::__cxx11::string::~string((string *)local_a0);
  pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
  local_50.piece_ = absl::lts_20250127::NullSafeStringView("/bar");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_a0,(lts_20250127 *)(local_a0 + 0x20),&local_50,&local_50);
  File::CreateDir((File *)&local_b0,(string *)local_a0,0x1ff);
  if (local_b0.super_LogMessage._0_8_ == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_b0,
                             "File::CreateDir(dirname, 0777) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&local_b0);
  if (local_b0.super_LogMessage._0_8_ == 1) {
    std::__cxx11::string::~string((string *)local_a0);
    pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    local_50.piece_ = absl::lts_20250127::NullSafeStringView("/bar/baz");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_a0,(lts_20250127 *)(local_a0 + 0x20),&local_50,&local_50);
    DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_a0,(string *)"Blah.",contents_00);
    std::__cxx11::string::~string((string *)local_a0);
    pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    local_50.piece_ = absl::lts_20250127::NullSafeStringView("/bar");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_a0,(lts_20250127 *)(local_a0 + 0x20),&local_50,&local_50);
    disk_path._M_str = (char *)local_a0._0_8_;
    disk_path._M_len = local_a0._8_8_;
    DiskSourceTree::MapPath
              (&(this->super_DiskSourceTreeTest).source_tree_,
               (string_view)(ZEXT816(0xddc831) << 0x40),disk_path);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a0 + 0x20),"baz",(allocator<char> *)&local_50);
    DiskSourceTreeTest::ExpectFileContents
              (&this->super_DiskSourceTreeTest,(string *)(local_a0 + 0x20),"Blah.");
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a0 + 0x20),"../foo",(allocator<char> *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,(allocator<char> *)&local_b0);
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,(string *)(local_a0 + 0x20),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a0 + 0x20),"../bar/baz",(allocator<char> *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,(allocator<char> *)&local_b0);
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,(string *)(local_a0 + 0x20),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x10a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_b0);
}

Assistant:

TEST_F(DiskSourceTreeTest, NoParent) {
  // Test that we cannot open files in a parent of a mapped directory.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddSubdir(absl::StrCat(dirnames_[0], "/bar"));
  AddFile(absl::StrCat(dirnames_[0], "/bar/baz"), "Blah.");
  source_tree_.MapPath("", absl::StrCat(dirnames_[0], "/bar"));

  ExpectFileContents("baz", "Blah.");
  ExpectCannotOpenFile("../foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("../bar/baz",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
}